

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecHelper.cpp
# Opt level: O2

DataType getType(string *typeString)

{
  byte bVar1;
  DataType DVar2;
  helics *this;
  string_view sVar3;
  string_view trimCharacters;
  string_view input;
  
  trimCharacters._M_str = " \t\n\r";
  trimCharacters._M_len = 4;
  input._M_str = (typeString->_M_dataplus)._M_p;
  input._M_len = typeString->_M_string_length;
  sVar3 = gmlc::utilities::string_viewOps::trim(input,trimCharacters);
  this = (helics *)sVar3._M_len;
  if (this == (helics *)0x0) {
switchD_0022fe97_caseD_62:
    DVar2 = HELICS_CUSTOM;
  }
  else {
    if (this != (helics *)0x1) {
      sVar3._M_len = (size_t)sVar3._M_str;
      DVar2 = helics::getTypeFromString(this,sVar3);
      return DVar2;
    }
    bVar1 = *sVar3._M_str;
    DVar2 = HELICS_ANY;
    if (bVar1 - 0x41 < 9) {
      DVar2 = (*(code *)(&DAT_0038d760 + *(int *)(&DAT_0038d760 + (ulong)(bVar1 - 0x41) * 4)))();
      return DVar2;
    }
    switch(bVar1) {
    case 0x61:
      break;
    case 0x62:
    case 0x65:
    case 0x67:
    case 0x68:
      goto switchD_0022fe97_caseD_62;
    case 99:
      DVar2 = HELICS_COMPLEX;
      break;
    case 100:
    case 0x66:
      DVar2 = HELICS_DOUBLE;
      break;
    case 0x69:
      DVar2 = HELICS_INT;
      break;
    default:
      if (bVar1 != 0x53) {
        if ((bVar1 == 0x56) || (bVar1 == 0x76)) {
          return HELICS_VECTOR;
        }
        if (bVar1 != 0x73) goto switchD_0022fe97_caseD_62;
      }
      DVar2 = HELICS_STRING;
    }
  }
  return DVar2;
}

Assistant:

DataType getType(const std::string& typeString)
{
    auto tstr = gmlc::utilities::string_viewOps::trim(typeString);
    // trim the string
    if (tstr.empty()) {
        return DataType::HELICS_CUSTOM;
    }
    if (tstr.size() == 1) {
        switch (tstr[0]) {
            case 'a':
            case 'A':
                return DataType::HELICS_ANY;
            case 's':
            case 'S':
                return DataType::HELICS_STRING;
            case 'd':
            case 'D':
            case 'f':
            case 'F':
                return DataType::HELICS_DOUBLE;
            case 'i':
            case 'I':
                return DataType::HELICS_INT;
            case 'c':
            case 'C':
                return DataType::HELICS_COMPLEX;
            case 'v':
            case 'V':
                return DataType::HELICS_VECTOR;
            default:
                return DataType::HELICS_CUSTOM;
        }
    }

    return helics::getTypeFromString(tstr);
}